

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-send-immediate.c
# Opt level: O3

void cl_send_cb(uv_udp_send_t *req,int status)

{
  int iVar1;
  uv_udp_t *handle;
  uv_handle_t *handle_00;
  int64_t eval_b;
  int64_t eval_a;
  undefined1 auStack_20 [32];
  
  if (req == (uv_udp_send_t *)0x0) {
    auStack_20._0_8_ = (void *)0x1de40b;
    cl_send_cb_cold_3();
  }
  else {
    auStack_20._24_8_ = SEXT48(status);
    auStack_20._16_8_ = 0;
    if ((uv_close_cb)auStack_20._24_8_ == (uv_close_cb)0x0) {
      auStack_20._24_8_ = ZEXT18(req->handle == &client || req->handle == &server);
      auStack_20._16_8_ = 0;
      if ((uv_close_cb)auStack_20._24_8_ != (uv_close_cb)0x0) {
        cl_send_cb_called = cl_send_cb_called + 1;
        return;
      }
      goto LAB_001de41a;
    }
  }
  auStack_20._0_8_ = (void *)0x1de41a;
  cl_send_cb_cold_1();
LAB_001de41a:
  handle = (uv_udp_t *)(auStack_20 + 0x18);
  auStack_20._0_8_ = close_cb;
  cl_send_cb_cold_2();
  auStack_20._0_8_ = ZEXT18(handle == &client || handle == &server);
  if ((void *)auStack_20._0_8_ == (void *)0x0) {
    close_cb_cold_2();
  }
  else {
    auStack_20._0_8_ = (void *)0x1;
    iVar1 = uv_is_closing((uv_handle_t *)handle);
    if ((void *)auStack_20._0_8_ == (void *)(long)iVar1) {
      close_cb_called = close_cb_called + 1;
      return;
    }
  }
  handle_00 = (uv_handle_t *)auStack_20;
  close_cb_cold_1();
  iVar1 = uv_is_closing(handle_00);
  if (iVar1 != 0) {
    return;
  }
  uv_close(handle_00,(uv_close_cb)0x0);
  return;
}

Assistant:

static void cl_send_cb(uv_udp_send_t* req, int status) {
  ASSERT_NOT_NULL(req);
  ASSERT_OK(status);
  CHECK_HANDLE(req->handle);

  cl_send_cb_called++;
}